

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_iwad.cpp
# Opt level: O1

void __thiscall FIWadManager::CheckLumpName(FIWadManager *this,char *name)

{
  uint *puVar1;
  FIWADInfo *pFVar2;
  FString *pFVar3;
  int *piVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  if ((this->mIWads).Count != 0) {
    pFVar2 = (this->mIWads).Array;
    uVar6 = 0;
    do {
      if (pFVar2[uVar6].Lumps.Count != 0) {
        pFVar3 = pFVar2[uVar6].Lumps.Array;
        piVar4 = (this->mLumpsFound).Array;
        uVar7 = 0;
        do {
          iVar5 = strcasecmp(pFVar3[uVar7].Chars,name);
          if (iVar5 == 0) {
            puVar1 = (uint *)(piVar4 + uVar6);
            *puVar1 = *puVar1 | 1 << ((byte)uVar7 & 0x1f);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < pFVar2[uVar6].Lumps.Count);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (this->mIWads).Count);
  }
  return;
}

Assistant:

void FIWadManager::CheckLumpName(const char *name)
{
	for(unsigned i=0; i< mIWads.Size(); i++)
	{
		for(unsigned j=0; j < mIWads[i].Lumps.Size(); j++)
		{
			if (!mIWads[i].Lumps[j].CompareNoCase(name))
			{
				mLumpsFound[i] |= (1<<j);
			}
		}
	}
}